

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::UdpBodySyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,UdpBodySyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_70;
  SyntaxNode *local_60;
  size_t index_local;
  UdpBodySyntax *this_local;
  
  switch(index) {
  case 0:
    local_60 = (SyntaxNode *)0x0;
    if (this != (UdpBodySyntax *)0xfffffffffffffff0) {
      local_60 = &(this->portDecls).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->initialStmt->super_SyntaxNode);
    break;
  case 2:
    token.kind = (this->table).kind;
    token._2_1_ = (this->table).field_0x2;
    token.numFlags.raw = (this->table).numFlags.raw;
    token.rawLen = (this->table).rawLen;
    token.info = (this->table).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    local_70 = (SyntaxNode *)0x0;
    if (this != (UdpBodySyntax *)0xffffffffffffffa8) {
      local_70 = &(this->entries).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 4:
    token_00.kind = (this->endtable).kind;
    token_00._2_1_ = (this->endtable).field_0x2;
    token_00.numFlags.raw = (this->endtable).numFlags.raw;
    token_00.rawLen = (this->endtable).rawLen;
    token_00.info = (this->endtable).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax UdpBodySyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &portDecls;
        case 1: return initialStmt;
        case 2: return table;
        case 3: return &entries;
        case 4: return endtable;
        default: return nullptr;
    }
}